

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverselock_tests.cpp
# Opt level: O0

void __thiscall reverselock_tests::reverselock_errors::test_method(reverselock_errors *this)

{
  bool bVar1;
  lazy_ostream *_lock;
  long in_FS_OFFSET;
  bool failed;
  Mutex mutex;
  Mutex mutex2;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock2;
  reverse_lock revlock10;
  reverse_lock revlock9;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffa98;
  undefined7 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa7;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  reverse_lock *in_stack_fffffffffffffab8;
  undefined7 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac7;
  lazy_ostream *in_stack_fffffffffffffac8;
  const_string *in_stack_fffffffffffffad0;
  reverse_lock *prVar2;
  undefined7 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadf;
  undefined8 in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_fffffffffffffaf8;
  reverse_lock *in_stack_fffffffffffffb00;
  const_string local_480 [2];
  const_string local_408 [2];
  lazy_ostream local_3e8;
  assertion_result local_3c8 [2];
  const_string local_390 [2];
  lazy_ostream local_370 [2];
  assertion_result local_350 [2];
  const_string local_318 [2];
  lazy_ostream local_2f8 [2];
  assertion_result local_2d8 [2];
  const_string local_2a0 [2];
  lazy_ostream local_280 [2];
  assertion_result local_260 [2];
  const_string local_228 [2];
  lazy_ostream local_208 [2];
  assertion_result local_1e8 [2];
  const_string local_1b0 [2];
  lazy_ostream local_190 [2];
  assertion_result local_170 [15];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffa98);
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffa98);
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffa98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
             (AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffad0,
             (char *)in_stack_fffffffffffffac8,
             (char *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
             (int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffab8 >> 0x18,0));
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffa98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
             (AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffad0,
             (char *)in_stack_fffffffffffffac8,
             (char *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0),
             (int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffab8 >> 0x18,0));
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffa98);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
               in_stack_fffffffffffffad0,(size_t)in_stack_fffffffffffffac8,
               (const_string *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (bool)in_stack_fffffffffffffaa7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    in_stack_fffffffffffffa98 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_170,local_190,local_1b0,0x42,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             (char *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
             in_stack_fffffffffffffae8,(int)((ulong)in_stack_fffffffffffffae0 >> 0x20));
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(in_stack_fffffffffffffab8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
               in_stack_fffffffffffffad0,(size_t)in_stack_fffffffffffffac8,
               (const_string *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (bool)in_stack_fffffffffffffaa7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    in_stack_fffffffffffffa98 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e8,local_208,local_228,0x4b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
               in_stack_fffffffffffffad0,(size_t)in_stack_fffffffffffffac8,
               (const_string *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (bool)in_stack_fffffffffffffaa7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    in_stack_fffffffffffffa98 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_260,local_280,local_2a0,0x4c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)in_stack_fffffffffffffa98);
  do {
    prVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
               in_stack_fffffffffffffad0,(size_t)in_stack_fffffffffffffac8,
               (const_string *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (bool)in_stack_fffffffffffffaa7);
    _lock = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    in_stack_fffffffffffffa98 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2d8,local_2f8,local_318,0x53,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa98);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            (prVar2,(UniqueLock<AnnotatedMixin<std::mutex>_> *)_lock,
             (char *)CONCAT17(bVar1,in_stack_fffffffffffffaf0),in_stack_fffffffffffffae8,
             (int)((ulong)in_stack_fffffffffffffae0 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
               in_stack_fffffffffffffad0,(size_t)in_stack_fffffffffffffac8,
               (const_string *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (bool)in_stack_fffffffffffffaa7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    in_stack_fffffffffffffa98 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_350,local_370,local_390,0x56,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa98);
    in_stack_fffffffffffffadf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffadf);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(in_stack_fffffffffffffab8);
  do {
    prVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
               (const_string *)prVar2,(size_t)in_stack_fffffffffffffac8,
               (const_string *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (bool)in_stack_fffffffffffffaa7);
    in_stack_fffffffffffffac8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    in_stack_fffffffffffffa98 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3c8,&local_3e8,local_408,0x59,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa98);
    in_stack_fffffffffffffac7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffac7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
               (const_string *)prVar2,(size_t)in_stack_fffffffffffffac8,
               (const_string *)CONCAT17(in_stack_fffffffffffffac7,in_stack_fffffffffffffac0));
    std::unique_lock<std::mutex>::owns_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (bool)in_stack_fffffffffffffaa7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffa98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8),
               (pointer)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (unsigned_long)in_stack_fffffffffffffa98);
    in_stack_fffffffffffffa98 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffbc0,(lazy_ostream *)&stack0xfffffffffffffba0
               ,local_480,0x5a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffa98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffa98);
    in_stack_fffffffffffffaaf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffaaf);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffa98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffa98);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffa98);
  AnnotatedMixin<std::mutex>::~AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffa98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(reverselock_errors)
{
    Mutex mutex2;
    Mutex mutex;
    WAIT_LOCK(mutex2, lock2);
    WAIT_LOCK(mutex, lock);

#ifdef DEBUG_LOCKORDER
    bool prev = g_debug_lockorder_abort;
    g_debug_lockorder_abort = false;

    // Make sure trying to reverse lock a previous lock fails
    BOOST_CHECK_EXCEPTION(REVERSE_LOCK(lock2), std::logic_error, HasReason("lock2 was not most recent critical section locked"));
    BOOST_CHECK(lock2.owns_lock());

    g_debug_lockorder_abort = prev;
#endif

    // Make sure trying to reverse lock an unlocked lock fails
    lock.unlock();

    BOOST_CHECK(!lock.owns_lock());

    bool failed = false;
    try {
        REVERSE_LOCK(lock);
    } catch(...) {
        failed = true;
    }

    BOOST_CHECK(failed);
    BOOST_CHECK(!lock.owns_lock());

    // Locking the original lock after it has been taken by a reverse lock
    // makes no sense. Ensure that the original lock no longer owns the lock
    // after giving it to a reverse one.

    lock.lock();
    BOOST_CHECK(lock.owns_lock());
    {
        REVERSE_LOCK(lock);
        BOOST_CHECK(!lock.owns_lock());
    }

    BOOST_CHECK(failed);
    BOOST_CHECK(lock.owns_lock());
}